

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats_recorder.cpp
# Opt level: O0

int __thiscall RunStatsRecorder::append_to(RunStatsRecorder *this,CSVStringTable *st)

{
  uint uVar1;
  uint uVar2;
  CSVStringTable *unaff_retaddr;
  uint new_row;
  int ret;
  uint in_stack_fffffffffffffffc;
  
  uVar1 = CSVTable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::addRows(st,ret);
  uVar2 = update_row((RunStatsRecorder *)CONCAT44(ret,new_row),unaff_retaddr,
                     in_stack_fffffffffffffffc);
  if (uVar2 != 0) {
    uVar1 = uVar2;
  }
  return uVar1;
}

Assistant:

int RunStatsRecorder::append_to(CSVStringTable& st) const{
  int ret;
  unsigned new_row = st.addRows(1);

  if ((ret = update_row(st, new_row)))
    return ret;
  else
    return new_row;
}